

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O0

int __thiscall CaDiCaL::Internal::clause_contains_fixed_literal(Internal *this,Clause *c)

{
  Internal *pIVar1;
  Clause *in_RSI;
  int tmp;
  int *lit;
  literal_iterator __end1;
  literal_iterator __begin1;
  Clause *__range1;
  int falsified;
  int satisfied;
  int in_stack_ffffffffffffffbc;
  Internal *local_30;
  int local_20;
  int local_1c;
  int local_4;
  
  local_1c = 0;
  local_20 = 0;
  local_30 = (Internal *)Clause::begin(in_RSI);
  pIVar1 = (Internal *)Clause::end(in_RSI);
  for (; local_30 != pIVar1; local_30 = (Internal *)&local_30->unsat) {
    in_stack_ffffffffffffffbc = fixed(local_30,in_stack_ffffffffffffffbc);
    if (0 < in_stack_ffffffffffffffbc) {
      local_1c = local_1c + 1;
    }
    if (in_stack_ffffffffffffffbc < 0) {
      local_20 = local_20 + 1;
    }
  }
  if (local_1c == 0) {
    if (local_20 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Internal::clause_contains_fixed_literal (Clause *c) {
  int satisfied = 0, falsified = 0;
  for (const auto &lit : *c) {
    const int tmp = fixed (lit);
    if (tmp > 0) {
      LOG (c, "root level satisfied literal %d in", lit);
      satisfied++;
    }
    if (tmp < 0) {
      LOG (c, "root level falsified literal %d in", lit);
      falsified++;
    }
  }
  if (satisfied)
    return 1;
  else if (falsified)
    return -1;
  else
    return 0;
}